

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswPairs.c
# Opt level: O3

Vec_Int_t *
Ssw_TransferSignalPairs
          (Aig_Man_t *pMiter,Aig_Man_t *pAig1,Aig_Man_t *pAig2,Vec_Int_t *vIds1,Vec_Int_t *vIds2)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Int_t *p;
  int *piVar4;
  void *pvVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  
  iVar1 = vIds1->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar1 * 2 - 1U) {
    iVar7 = iVar1 * 2;
  }
  p->nSize = 0;
  p->nCap = iVar7;
  if (iVar7 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar7 << 2);
  }
  p->pArray = piVar4;
  if (0 < iVar1) {
    lVar8 = 0;
    do {
      pVVar3 = pAig1->vObjs;
      if (pVVar3 == (Vec_Ptr_t *)0x0) {
        pvVar5 = (void *)0x0;
      }
      else {
        uVar2 = vIds1->pArray[lVar8];
        if (((int)uVar2 < 0) || (pVVar3->nSize <= (int)uVar2)) goto LAB_005eef45;
        pvVar5 = pVVar3->pArray[uVar2];
      }
      if (vIds2->nSize <= lVar8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = vIds2->pArray[lVar8];
      if (((long)iVar1 < 0) || (pAig2->vObjs->nSize <= iVar1)) {
LAB_005eef45:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar6 = *(ulong *)((long)pvVar5 + 0x28) & 0xfffffffffffffffe;
      if ((uVar6 == 0) ||
         (uVar9 = *(ulong *)((long)pAig2->vObjs->pArray[iVar1] + 0x28) & 0xfffffffffffffffe,
         uVar9 == 0)) {
        __assert_fail("pObj1m && pObj2m",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswPairs.c"
                      ,0x79,
                      "Vec_Int_t *Ssw_TransferSignalPairs(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      if (uVar6 != uVar9) {
        iVar1 = *(int *)(uVar6 + 0x24);
        piVar4 = (int *)(uVar9 + 0x24);
        if (*piVar4 <= iVar1) {
          uVar9 = uVar6;
          iVar1 = *piVar4;
        }
        Vec_IntPush(p,iVar1);
        Vec_IntPush(p,*(int *)(uVar9 + 0x24));
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < vIds1->nSize);
  }
  return p;
}

Assistant:

Vec_Int_t * Ssw_TransferSignalPairs( Aig_Man_t * pMiter, Aig_Man_t * pAig1, Aig_Man_t * pAig2, Vec_Int_t * vIds1, Vec_Int_t * vIds2 )
{
    Vec_Int_t * vIds;
    Aig_Obj_t * pObj1, * pObj2;
    Aig_Obj_t * pObj1m, * pObj2m;
    int i;
    vIds = Vec_IntAlloc( 2 * Vec_IntSize(vIds1) );
    for ( i = 0; i < Vec_IntSize(vIds1); i++ )
    {
        pObj1 = Aig_ManObj( pAig1, Vec_IntEntry(vIds1, i) );
        pObj2 = Aig_ManObj( pAig2, Vec_IntEntry(vIds2, i) );
        pObj1m = Aig_Regular((Aig_Obj_t *)pObj1->pData);
        pObj2m = Aig_Regular((Aig_Obj_t *)pObj2->pData);
        assert( pObj1m && pObj2m );
        if ( pObj1m == pObj2m )
            continue;
        if ( pObj1m->Id < pObj2m->Id )
        {
            Vec_IntPush( vIds, pObj1m->Id );
            Vec_IntPush( vIds, pObj2m->Id );
        }
        else
        {
            Vec_IntPush( vIds, pObj2m->Id );
            Vec_IntPush( vIds, pObj1m->Id );
        }
    }
    return vIds;
}